

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_edge_sse4.c
# Opt level: O0

void av1_filter_intra_edge_sse4_1(uint8_t *p,int sz,int strength)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int in_EDX;
  int in_ESI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  __m128i d3;
  __m128i d2;
  __m128i d1_1;
  __m128i d0_1;
  int n_out_1;
  __m128i in0_1;
  __m128i iden_1;
  __m128i shuf_d;
  __m128i shuf_c;
  __m128i shuf_b;
  __m128i shuf_a;
  __m128i two;
  __m128i coef0_1;
  __m128i in1;
  __m128i mask;
  __m128i n0;
  __m128i out0;
  __m128i eight;
  __m128i d1;
  __m128i d0;
  int n_out;
  __m128i in0;
  __m128i iden;
  __m128i shuf1;
  __m128i shuf0;
  __m128i coef0;
  int use_3tap_filter;
  int len;
  uint8_t *out;
  uint8_t *in;
  __m128i last;
  int local_7b8;
  int local_7ac;
  undefined1 (*local_7a8) [16];
  undefined8 local_718;
  undefined8 uStack_710;
  char local_6fc;
  undefined1 local_6e8 [16];
  undefined8 uStack_6d0;
  undefined8 local_618;
  undefined8 uStack_610;
  char local_5fc;
  undefined1 local_5e8 [16];
  int local_59c;
  undefined1 (*local_598) [16];
  undefined1 (*local_590) [16];
  short local_2b8;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  short sStack_2aa;
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  short sStack_28a;
  short local_238;
  short sStack_236;
  short sStack_234;
  short sStack_232;
  short sStack_230;
  short sStack_22e;
  short sStack_22c;
  short sStack_22a;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  char local_208;
  char cStack_207;
  char cStack_206;
  char cStack_205;
  char cStack_204;
  char cStack_203;
  char cStack_202;
  char cStack_201;
  char cStack_200;
  char cStack_1ff;
  char cStack_1fe;
  char cStack_1fd;
  char cStack_1fc;
  char cStack_1fb;
  char cStack_1fa;
  char cStack_1f9;
  char local_1e8;
  char cStack_1e7;
  char cStack_1e6;
  char cStack_1e5;
  char cStack_1e4;
  char cStack_1e3;
  char cStack_1e2;
  char cStack_1e1;
  char cStack_1e0;
  char cStack_1df;
  char cStack_1de;
  char cStack_1dd;
  char cStack_1dc;
  char cStack_1db;
  char cStack_1da;
  char cStack_1d9;
  undefined8 local_168;
  undefined8 local_148;
  char local_d8;
  char cStack_d7;
  char cStack_d6;
  char cStack_d5;
  char cStack_d4;
  char cStack_d3;
  char cStack_d2;
  char cStack_d1;
  char cStack_d0;
  char cStack_cf;
  char cStack_ce;
  char cStack_cd;
  char cStack_cc;
  char cStack_cb;
  char cStack_ca;
  char cStack_c9;
  undefined1 local_b8 [8];
  undefined1 local_b0 [96];
  __m128i in1_1;
  __m128i mask_1;
  __m128i n0_1;
  __m128i out0_1;
  __m128i eight_1;
  
  if (in_EDX != 0) {
    in_RDI[-1][0xf] = (*in_RDI)[0];
    local_b0[2] = (*in_RDI)[in_ESI + -1];
    local_b0[1] = local_b0[2];
    local_b0[0] = local_b0[2];
    local_b8[2] = local_b0[2];
    local_b8[1] = local_b0[2];
    local_b8[0] = local_b0[2];
    auVar6[3] = local_b0[2];
    auVar6._0_3_ = local_b8._0_3_;
    auVar6[4] = local_b0[2];
    auVar6[5] = local_b0[2];
    auVar6[6] = local_b0[2];
    auVar6[7] = local_b0[2];
    auVar6[0xb] = local_b0[2];
    auVar6._8_3_ = local_b0._0_3_;
    auVar6[0xc] = local_b0[2];
    auVar6[0xd] = local_b0[2];
    auVar6[0xe] = local_b0[2];
    auVar6[0xf] = local_b0[2];
    *(undefined1 (*) [16])(*in_RDI + in_ESI) = auVar6;
    local_7a8 = in_RDI;
    if (in_EDX == 3) {
      local_7a8 = (undefined1 (*) [16])(in_RDI[-1] + 0xf);
    }
    local_590 = local_7a8;
    local_598 = (undefined1 (*) [16])(*in_RDI + 1);
    local_59c = in_ESI + -1;
    if (in_EDX < 3) {
      auVar6 = lddqu(auVar6,(undefined1  [16])av1_filter_intra_edge_sse4_1::kern[in_EDX + -1]);
      auVar7 = lddqu(auVar6,(undefined1  [16])av1_filter_intra_edge_sse4_1::v_const[0]);
      auVar8 = lddqu(auVar7,(undefined1  [16])av1_filter_intra_edge_sse4_1::v_const[1]);
      local_5e8 = lddqu(auVar8,(undefined1  [16])av1_filter_intra_edge_sse4_1::v_const[3]);
      auVar9 = lddqu(local_5e8,*local_7a8);
      for (; 0 < local_59c; local_59c = local_59c - local_7ac) {
        if (local_59c < 8) {
          local_7ac = local_59c;
        }
        else {
          local_7ac = 8;
        }
        auVar10 = pshufb(auVar9,auVar7);
        auVar11 = pshufb(auVar9,auVar8);
        auVar10 = pmaddubsw(auVar10,auVar6);
        auVar11 = pmaddubsw(auVar11,auVar6);
        auVar10 = phaddw(auVar10,auVar11);
        local_298 = auVar10._0_2_;
        sStack_296 = auVar10._2_2_;
        sStack_294 = auVar10._4_2_;
        sStack_292 = auVar10._6_2_;
        sStack_290 = auVar10._8_2_;
        sStack_28e = auVar10._10_2_;
        sStack_28c = auVar10._12_2_;
        sStack_28a = auVar10._14_2_;
        local_618._0_4_ = CONCAT22(sStack_296 + 8,local_298 + 8);
        local_618._0_6_ = CONCAT24(sStack_294 + 8,(undefined4)local_618);
        local_618 = CONCAT26(sStack_292 + 8,(undefined6)local_618);
        uStack_610._0_2_ = sStack_290 + 8;
        uStack_610._2_2_ = sStack_28e + 8;
        uStack_610._4_2_ = sStack_28c + 8;
        uStack_610._6_2_ = sStack_28a + 8;
        auVar1._8_8_ = uStack_610;
        auVar1._0_8_ = local_618;
        auVar10 = psraw(auVar1,ZEXT416(4));
        local_218 = auVar10._0_2_;
        sStack_216 = auVar10._2_2_;
        sStack_214 = auVar10._4_2_;
        sStack_212 = auVar10._6_2_;
        sStack_210 = auVar10._8_2_;
        sStack_20e = auVar10._10_2_;
        sStack_20c = auVar10._12_2_;
        sStack_20a = auVar10._14_2_;
        auVar12._0_8_ =
             CONCAT17((0 < sStack_20a) * (sStack_20a < 0x100) * auVar10[0xe] - (0xff < sStack_20a),
                      CONCAT16((0 < sStack_20c) * (sStack_20c < 0x100) * auVar10[0xc] -
                               (0xff < sStack_20c),
                               CONCAT15((0 < sStack_20e) * (sStack_20e < 0x100) * auVar10[10] -
                                        (0xff < sStack_20e),
                                        CONCAT14((0 < sStack_210) * (sStack_210 < 0x100) *
                                                 auVar10[8] - (0xff < sStack_210),
                                                 CONCAT13((0 < sStack_212) * (sStack_212 < 0x100) *
                                                          auVar10[6] - (0xff < sStack_212),
                                                          CONCAT12((0 < sStack_214) *
                                                                   (sStack_214 < 0x100) * auVar10[4]
                                                                   - (0xff < sStack_214),
                                                                   CONCAT11((0 < sStack_216) *
                                                                            (sStack_216 < 0x100) *
                                                                            auVar10[2] -
                                                                            (0xff < sStack_216),
                                                                            (0 < local_218) *
                                                                            (local_218 < 0x100) *
                                                                            auVar10[0] -
                                                                            (0xff < local_218)))))))
                     );
        auVar12[8] = (0 < local_218) * (local_218 < 0x100) * auVar10[0] - (0xff < local_218);
        auVar12[9] = (0 < sStack_216) * (sStack_216 < 0x100) * auVar10[2] - (0xff < sStack_216);
        auVar12[10] = (0 < sStack_214) * (sStack_214 < 0x100) * auVar10[4] - (0xff < sStack_214);
        auVar12[0xb] = (0 < sStack_212) * (sStack_212 < 0x100) * auVar10[6] - (0xff < sStack_212);
        auVar12[0xc] = (0 < sStack_210) * (sStack_210 < 0x100) * auVar10[8] - (0xff < sStack_210);
        auVar12[0xd] = (0 < sStack_20e) * (sStack_20e < 0x100) * auVar10[10] - (0xff < sStack_20e);
        auVar12[0xe] = (0 < sStack_20c) * (sStack_20c < 0x100) * auVar10[0xc] - (0xff < sStack_20c);
        auVar12[0xf] = (0 < sStack_20a) * (sStack_20a < 0x100) * auVar10[0xe] - (0xff < sStack_20a);
        auVar10 = lddqu(auVar12,*local_598);
        local_5fc = (char)local_7ac;
        local_1e8 = local_5e8[0];
        cStack_1e7 = local_5e8[1];
        cStack_1e6 = local_5e8[2];
        cStack_1e5 = local_5e8[3];
        cStack_1e4 = local_5e8[4];
        cStack_1e3 = local_5e8[5];
        cStack_1e2 = local_5e8[6];
        cStack_1e1 = local_5e8[7];
        cStack_1e0 = local_5e8[8];
        cStack_1df = local_5e8[9];
        cStack_1de = local_5e8[10];
        cStack_1dd = local_5e8[0xb];
        cStack_1dc = local_5e8[0xc];
        cStack_1db = local_5e8[0xd];
        cStack_1da = local_5e8[0xe];
        cStack_1d9 = local_5e8[0xf];
        uStack_610 = auVar12._8_8_;
        auVar4[1] = -(cStack_1e7 < local_5fc);
        auVar4[0] = -(local_1e8 < local_5fc);
        auVar4[2] = -(cStack_1e6 < local_5fc);
        auVar4[3] = -(cStack_1e5 < local_5fc);
        auVar4[4] = -(cStack_1e4 < local_5fc);
        auVar4[5] = -(cStack_1e3 < local_5fc);
        auVar4[6] = -(cStack_1e2 < local_5fc);
        auVar4[7] = -(cStack_1e1 < local_5fc);
        auVar4[9] = -(cStack_1df < local_5fc);
        auVar4[8] = -(cStack_1e0 < local_5fc);
        auVar4[10] = -(cStack_1de < local_5fc);
        auVar4[0xb] = -(cStack_1dd < local_5fc);
        auVar4[0xc] = -(cStack_1dc < local_5fc);
        auVar4[0xd] = -(cStack_1db < local_5fc);
        auVar4[0xe] = -(cStack_1da < local_5fc);
        auVar4[0xf] = -(cStack_1d9 < local_5fc);
        auVar5._8_8_ = uStack_610;
        auVar5._0_8_ = auVar12._0_8_;
        auVar10 = pblendvb(auVar10,auVar5,auVar4);
        local_148 = auVar10._0_8_;
        *(undefined8 *)*local_598 = local_148;
        lddqu(auVar10,local_590[1]);
        local_5e8[1] = -(cStack_1e7 < local_5fc);
        local_5e8[0] = -(local_1e8 < local_5fc);
        local_5e8[2] = -(cStack_1e6 < local_5fc);
        local_5e8[3] = -(cStack_1e5 < local_5fc);
        local_5e8[4] = -(cStack_1e4 < local_5fc);
        local_5e8[5] = -(cStack_1e3 < local_5fc);
        local_5e8[6] = -(cStack_1e2 < local_5fc);
        local_5e8[7] = -(cStack_1e1 < local_5fc);
        local_590 = (undefined1 (*) [16])(*local_590 + 8);
        local_598 = (undefined1 (*) [16])(*local_598 + 8);
      }
    }
    else {
      auVar6 = lddqu(auVar6,(undefined1  [16])av1_filter_intra_edge_sse4_1::kern[in_EDX + -1]);
      auVar7._8_8_ = 0x202020202020202;
      auVar7._0_8_ = 0x202020202020202;
      auVar7 = lddqu(auVar7,(undefined1  [16])av1_filter_intra_edge_sse4_1::v_const[2]);
      local_d8 = auVar7[0];
      cStack_d7 = auVar7[1];
      cStack_d6 = auVar7[2];
      cStack_d5 = auVar7[3];
      cStack_d4 = auVar7[4];
      cStack_d3 = auVar7[5];
      cStack_d2 = auVar7[6];
      cStack_d1 = auVar7[7];
      cStack_d0 = auVar7[8];
      cStack_cf = auVar7[9];
      cStack_ce = auVar7[10];
      cStack_cd = auVar7[0xb];
      cStack_cc = auVar7[0xc];
      cStack_cb = auVar7[0xd];
      cStack_ca = auVar7[0xe];
      cStack_c9 = auVar7[0xf];
      auVar8._0_8_ = CONCAT17(cStack_d1 + '\x06',
                              CONCAT16(cStack_d2 + '\x06',
                                       CONCAT15(cStack_d3 + '\x06',
                                                CONCAT14(cStack_d4 + '\x06',
                                                         CONCAT13(cStack_d5 + '\x06',
                                                                  CONCAT12(cStack_d6 + '\x06',
                                                                           CONCAT11(cStack_d7 +
                                                                                    '\x06',local_d8 
                                                  + '\x06')))))));
      auVar8[8] = cStack_d0 + '\x06';
      auVar8[9] = cStack_cf + '\x06';
      auVar8[10] = cStack_ce + '\x06';
      auVar8[0xb] = cStack_cd + '\x06';
      auVar8[0xc] = cStack_cc + '\x06';
      auVar8[0xd] = cStack_cb + '\x06';
      auVar8[0xe] = cStack_ca + '\x06';
      auVar8[0xf] = cStack_c9 + '\x06';
      local_6e8 = lddqu(auVar8,(undefined1  [16])av1_filter_intra_edge_sse4_1::v_const[3]);
      auVar9 = lddqu(local_6e8,*local_7a8);
      for (; 0 < local_59c; local_59c = local_59c - local_7b8) {
        if (local_59c < 8) {
          local_7b8 = local_59c;
        }
        else {
          local_7b8 = 8;
        }
        auVar13 = pshufb(auVar9,auVar7);
        auVar14[1] = cStack_d7 + '\x02';
        auVar14[0] = local_d8 + '\x02';
        auVar14[2] = cStack_d6 + '\x02';
        auVar14[3] = cStack_d5 + '\x02';
        auVar14[4] = cStack_d4 + '\x02';
        auVar14[5] = cStack_d3 + '\x02';
        auVar14[6] = cStack_d2 + '\x02';
        auVar14[7] = cStack_d1 + '\x02';
        auVar14[9] = cStack_cf + '\x02';
        auVar14[8] = cStack_d0 + '\x02';
        auVar14[10] = cStack_ce + '\x02';
        auVar14[0xb] = cStack_cd + '\x02';
        auVar14[0xc] = cStack_cc + '\x02';
        auVar14[0xd] = cStack_cb + '\x02';
        auVar14[0xe] = cStack_ca + '\x02';
        auVar14[0xf] = cStack_c9 + '\x02';
        auVar14 = pshufb(auVar9,auVar14);
        auVar11[1] = cStack_d7 + '\x04';
        auVar11[0] = local_d8 + '\x04';
        auVar11[2] = cStack_d6 + '\x04';
        auVar11[3] = cStack_d5 + '\x04';
        auVar11[4] = cStack_d4 + '\x04';
        auVar11[5] = cStack_d3 + '\x04';
        auVar11[6] = cStack_d2 + '\x04';
        auVar11[7] = cStack_d1 + '\x04';
        auVar11[9] = cStack_cf + '\x04';
        auVar11[8] = cStack_d0 + '\x04';
        auVar11[10] = cStack_ce + '\x04';
        auVar11[0xb] = cStack_cd + '\x04';
        auVar11[0xc] = cStack_cc + '\x04';
        auVar11[0xd] = cStack_cb + '\x04';
        auVar11[0xe] = cStack_ca + '\x04';
        auVar11[0xf] = cStack_c9 + '\x04';
        auVar11 = pshufb(auVar9,auVar11);
        uStack_6d0 = auVar8._8_8_;
        auVar10._8_8_ = uStack_6d0;
        auVar10._0_8_ = auVar8._0_8_;
        auVar10 = pshufb(auVar9,auVar10);
        auVar13 = pmaddubsw(auVar13,auVar6);
        auVar14 = pmaddubsw(auVar14,auVar6);
        auVar11 = pmaddubsw(auVar11,auVar6);
        auVar10 = pmaddubsw(auVar10,auVar6);
        auVar14 = phaddw(auVar13,auVar14);
        auVar10 = phaddw(auVar11,auVar10);
        auVar10 = phaddw(auVar14,auVar10);
        local_2b8 = auVar10._0_2_;
        sStack_2b6 = auVar10._2_2_;
        sStack_2b4 = auVar10._4_2_;
        sStack_2b2 = auVar10._6_2_;
        sStack_2b0 = auVar10._8_2_;
        sStack_2ae = auVar10._10_2_;
        sStack_2ac = auVar10._12_2_;
        sStack_2aa = auVar10._14_2_;
        local_718._0_4_ = CONCAT22(sStack_2b6 + 8,local_2b8 + 8);
        local_718._0_6_ = CONCAT24(sStack_2b4 + 8,(undefined4)local_718);
        local_718 = CONCAT26(sStack_2b2 + 8,(undefined6)local_718);
        uStack_710._0_2_ = sStack_2b0 + 8;
        uStack_710._2_2_ = sStack_2ae + 8;
        uStack_710._4_2_ = sStack_2ac + 8;
        uStack_710._6_2_ = sStack_2aa + 8;
        auVar13._8_8_ = uStack_710;
        auVar13._0_8_ = local_718;
        auVar10 = psraw(auVar13,ZEXT416(4));
        local_238 = auVar10._0_2_;
        sStack_236 = auVar10._2_2_;
        sStack_234 = auVar10._4_2_;
        sStack_232 = auVar10._6_2_;
        sStack_230 = auVar10._8_2_;
        sStack_22e = auVar10._10_2_;
        sStack_22c = auVar10._12_2_;
        sStack_22a = auVar10._14_2_;
        auVar15._0_8_ =
             CONCAT17((0 < sStack_22a) * (sStack_22a < 0x100) * auVar10[0xe] - (0xff < sStack_22a),
                      CONCAT16((0 < sStack_22c) * (sStack_22c < 0x100) * auVar10[0xc] -
                               (0xff < sStack_22c),
                               CONCAT15((0 < sStack_22e) * (sStack_22e < 0x100) * auVar10[10] -
                                        (0xff < sStack_22e),
                                        CONCAT14((0 < sStack_230) * (sStack_230 < 0x100) *
                                                 auVar10[8] - (0xff < sStack_230),
                                                 CONCAT13((0 < sStack_232) * (sStack_232 < 0x100) *
                                                          auVar10[6] - (0xff < sStack_232),
                                                          CONCAT12((0 < sStack_234) *
                                                                   (sStack_234 < 0x100) * auVar10[4]
                                                                   - (0xff < sStack_234),
                                                                   CONCAT11((0 < sStack_236) *
                                                                            (sStack_236 < 0x100) *
                                                                            auVar10[2] -
                                                                            (0xff < sStack_236),
                                                                            (0 < local_238) *
                                                                            (local_238 < 0x100) *
                                                                            auVar10[0] -
                                                                            (0xff < local_238)))))))
                     );
        auVar15[8] = (0 < local_238) * (local_238 < 0x100) * auVar10[0] - (0xff < local_238);
        auVar15[9] = (0 < sStack_236) * (sStack_236 < 0x100) * auVar10[2] - (0xff < sStack_236);
        auVar15[10] = (0 < sStack_234) * (sStack_234 < 0x100) * auVar10[4] - (0xff < sStack_234);
        auVar15[0xb] = (0 < sStack_232) * (sStack_232 < 0x100) * auVar10[6] - (0xff < sStack_232);
        auVar15[0xc] = (0 < sStack_230) * (sStack_230 < 0x100) * auVar10[8] - (0xff < sStack_230);
        auVar15[0xd] = (0 < sStack_22e) * (sStack_22e < 0x100) * auVar10[10] - (0xff < sStack_22e);
        auVar15[0xe] = (0 < sStack_22c) * (sStack_22c < 0x100) * auVar10[0xc] - (0xff < sStack_22c);
        auVar15[0xf] = (0 < sStack_22a) * (sStack_22a < 0x100) * auVar10[0xe] - (0xff < sStack_22a);
        auVar10 = lddqu(auVar15,*local_598);
        local_6fc = (char)local_7b8;
        local_208 = local_6e8[0];
        cStack_207 = local_6e8[1];
        cStack_206 = local_6e8[2];
        cStack_205 = local_6e8[3];
        cStack_204 = local_6e8[4];
        cStack_203 = local_6e8[5];
        cStack_202 = local_6e8[6];
        cStack_201 = local_6e8[7];
        cStack_200 = local_6e8[8];
        cStack_1ff = local_6e8[9];
        cStack_1fe = local_6e8[10];
        cStack_1fd = local_6e8[0xb];
        cStack_1fc = local_6e8[0xc];
        cStack_1fb = local_6e8[0xd];
        cStack_1fa = local_6e8[0xe];
        cStack_1f9 = local_6e8[0xf];
        uStack_710 = auVar15._8_8_;
        auVar2[1] = -(cStack_207 < local_6fc);
        auVar2[0] = -(local_208 < local_6fc);
        auVar2[2] = -(cStack_206 < local_6fc);
        auVar2[3] = -(cStack_205 < local_6fc);
        auVar2[4] = -(cStack_204 < local_6fc);
        auVar2[5] = -(cStack_203 < local_6fc);
        auVar2[6] = -(cStack_202 < local_6fc);
        auVar2[7] = -(cStack_201 < local_6fc);
        auVar2[9] = -(cStack_1ff < local_6fc);
        auVar2[8] = -(cStack_200 < local_6fc);
        auVar2[10] = -(cStack_1fe < local_6fc);
        auVar2[0xb] = -(cStack_1fd < local_6fc);
        auVar2[0xc] = -(cStack_1fc < local_6fc);
        auVar2[0xd] = -(cStack_1fb < local_6fc);
        auVar2[0xe] = -(cStack_1fa < local_6fc);
        auVar2[0xf] = -(cStack_1f9 < local_6fc);
        auVar3._8_8_ = uStack_710;
        auVar3._0_8_ = auVar15._0_8_;
        auVar10 = pblendvb(auVar10,auVar3,auVar2);
        local_168 = auVar10._0_8_;
        *(undefined8 *)*local_598 = local_168;
        lddqu(auVar10,local_590[1]);
        local_6e8[1] = -(cStack_207 < local_6fc);
        local_6e8[0] = -(local_208 < local_6fc);
        local_6e8[2] = -(cStack_206 < local_6fc);
        local_6e8[3] = -(cStack_205 < local_6fc);
        local_6e8[4] = -(cStack_204 < local_6fc);
        local_6e8[5] = -(cStack_203 < local_6fc);
        local_6e8[6] = -(cStack_202 < local_6fc);
        local_6e8[7] = -(cStack_201 < local_6fc);
        local_590 = (undefined1 (*) [16])(*local_590 + 8);
        local_598 = (undefined1 (*) [16])(*local_598 + 8);
      }
    }
  }
  return;
}

Assistant:

void av1_filter_intra_edge_sse4_1(uint8_t *p, int sz, int strength) {
  if (!strength) return;

  DECLARE_ALIGNED(16, static const int8_t, kern[3][16]) = {
    { 4, 8, 4, 0, 4, 8, 4, 0, 4, 8, 4, 0, 4, 8, 4, 0 },  // strength 1: 4,8,4
    { 5, 6, 5, 0, 5, 6, 5, 0, 5, 6, 5, 0, 5, 6, 5, 0 },  // strength 2: 5,6,5
    { 2, 4, 4, 4, 2, 0, 0, 0, 2, 4, 4, 4, 2, 0, 0, 0 }  // strength 3: 2,4,4,4,2
  };

  DECLARE_ALIGNED(16, static const int8_t, v_const[5][16]) = {
    { 0, 1, 2, 3, 1, 2, 3, 4, 2, 3, 4, 5, 3, 4, 5, 6 },
    { 4, 5, 6, 7, 5, 6, 7, 8, 6, 7, 8, 9, 7, 8, 9, 10 },
    { 0, 1, 2, 3, 4, 5, 6, 7, 1, 2, 3, 4, 5, 6, 7, 8 },
    { 0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15 },
  };

  // Extend the first and last samples to simplify the loop for the 5-tap case
  p[-1] = p[0];
  __m128i last = _mm_set1_epi8((char)p[sz - 1]);
  _mm_storeu_si128((__m128i *)&p[sz], last);

  // Adjust input pointer for filter support area
  uint8_t *in = (strength == 3) ? p - 1 : p;

  // Avoid modifying first sample
  uint8_t *out = p + 1;
  int len = sz - 1;

  const int use_3tap_filter = (strength < 3);

  if (use_3tap_filter) {
    __m128i coef0 = _mm_lddqu_si128((__m128i const *)kern[strength - 1]);
    __m128i shuf0 = _mm_lddqu_si128((__m128i const *)v_const[0]);
    __m128i shuf1 = _mm_lddqu_si128((__m128i const *)v_const[1]);
    __m128i iden = _mm_lddqu_si128((__m128i *)v_const[3]);
    __m128i in0 = _mm_lddqu_si128((__m128i *)in);
    while (len > 0) {
      int n_out = (len < 8) ? len : 8;
      __m128i d0 = _mm_shuffle_epi8(in0, shuf0);
      __m128i d1 = _mm_shuffle_epi8(in0, shuf1);
      d0 = _mm_maddubs_epi16(d0, coef0);
      d1 = _mm_maddubs_epi16(d1, coef0);
      d0 = _mm_hadd_epi16(d0, d1);
      __m128i eight = _mm_set1_epi16(8);
      d0 = _mm_add_epi16(d0, eight);
      d0 = _mm_srai_epi16(d0, 4);
      d0 = _mm_packus_epi16(d0, d0);
      __m128i out0 = _mm_lddqu_si128((__m128i *)out);
      __m128i n0 = _mm_set1_epi8(n_out);
      __m128i mask = _mm_cmpgt_epi8(n0, iden);
      out0 = _mm_blendv_epi8(out0, d0, mask);
      _mm_storel_epi64((__m128i *)out, out0);
      __m128i in1 = _mm_lddqu_si128((__m128i *)(in + 16));
      in0 = _mm_alignr_epi8(in1, in0, 8);
      in += 8;
      out += 8;
      len -= n_out;
    }
  } else {  // 5-tap filter
    __m128i coef0 = _mm_lddqu_si128((__m128i const *)kern[strength - 1]);
    __m128i two = _mm_set1_epi8(2);
    __m128i shuf_a = _mm_lddqu_si128((__m128i const *)v_const[2]);
    __m128i shuf_b = _mm_add_epi8(shuf_a, two);
    __m128i shuf_c = _mm_add_epi8(shuf_b, two);
    __m128i shuf_d = _mm_add_epi8(shuf_c, two);
    __m128i iden = _mm_lddqu_si128((__m128i *)v_const[3]);
    __m128i in0 = _mm_lddqu_si128((__m128i *)in);
    while (len > 0) {
      int n_out = (len < 8) ? len : 8;
      __m128i d0 = _mm_shuffle_epi8(in0, shuf_a);
      __m128i d1 = _mm_shuffle_epi8(in0, shuf_b);
      __m128i d2 = _mm_shuffle_epi8(in0, shuf_c);
      __m128i d3 = _mm_shuffle_epi8(in0, shuf_d);
      d0 = _mm_maddubs_epi16(d0, coef0);
      d1 = _mm_maddubs_epi16(d1, coef0);
      d2 = _mm_maddubs_epi16(d2, coef0);
      d3 = _mm_maddubs_epi16(d3, coef0);
      d0 = _mm_hadd_epi16(d0, d1);
      d2 = _mm_hadd_epi16(d2, d3);
      d0 = _mm_hadd_epi16(d0, d2);
      __m128i eight = _mm_set1_epi16(8);
      d0 = _mm_add_epi16(d0, eight);
      d0 = _mm_srai_epi16(d0, 4);
      d0 = _mm_packus_epi16(d0, d0);
      __m128i out0 = _mm_lddqu_si128((__m128i *)out);
      __m128i n0 = _mm_set1_epi8(n_out);
      __m128i mask = _mm_cmpgt_epi8(n0, iden);
      out0 = _mm_blendv_epi8(out0, d0, mask);
      _mm_storel_epi64((__m128i *)out, out0);
      __m128i in1 = _mm_lddqu_si128((__m128i *)(in + 16));
      in0 = _mm_alignr_epi8(in1, in0, 8);
      in += 8;
      out += 8;
      len -= n_out;
    }
  }
}